

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers_iforest.hpp
# Opt level: O2

vector<double,_std::allocator<double>_> *
calc_kurtosis_all_data<InputData<double,int>,double>
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          InputData<double,_int> *input_data,ModelParams *model_params,Xoshiro256PP *rnd_generator)

{
  ulong uVar1;
  double *pdVar2;
  int *Xc_indptr;
  double *pdVar3;
  pointer __p;
  pointer __p_00;
  pointer __p_01;
  vector<double,_std::allocator<double>_> *__range1;
  double *pdVar4;
  size_t col;
  ulong uVar5;
  double dVar6;
  unique_ptr<double[],_std::default_delete<double[]>_> buffer_double;
  unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> buffer_size_t;
  __uniq_ptr_impl<double,_std::default_delete<double[]>_> local_38;
  
  buffer_double._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
  buffer_size_t._M_t.super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long[]>,_true,_true>)
       (__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>)0x0;
  if (input_data->ncols_categ != 0) {
    uVar5 = (long)input_data->max_categ * 8;
    if ((long)input_data->max_categ < 0) {
      uVar5 = 0xffffffffffffffff;
    }
    __p_00 = (pointer)operator_new__(uVar5);
    local_38._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
    super__Head_base<0UL,_double_*,_false>._M_head_impl =
         (tuple<double_*,_std::default_delete<double[]>_>)
         (_Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>)0x0;
    std::__uniq_ptr_impl<double,_std::default_delete<double[]>_>::reset
              ((__uniq_ptr_impl<double,_std::default_delete<double[]>_> *)&buffer_double,__p_00);
    std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
              ((unique_ptr<double[],_std::default_delete<double[]>_> *)&local_38);
    if ((input_data->sample_weights == (double *)0x0) || (input_data->weight_as_sample == true)) {
      uVar5 = (long)input_data->max_categ * 8 + 8;
      if ((long)input_data->max_categ < -1) {
        uVar5 = 0xffffffffffffffff;
      }
      __p_01 = (pointer)operator_new__(uVar5);
      local_38._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
      super__Head_base<0UL,_double_*,_false>._M_head_impl =
           (tuple<double_*,_std::default_delete<double[]>_>)
           (_Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>)0x0;
      std::__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>::reset
                ((__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> *)
                 &buffer_size_t,__p_01);
      std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::~unique_ptr
                ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)&local_38);
    }
  }
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,input_data->ncols_categ + input_data->ncols_numeric,
             (allocator_type *)&local_38);
  for (uVar5 = 0; uVar1 = input_data->ncols_tot, uVar5 < uVar1; uVar5 = uVar5 + 1) {
    uVar1 = input_data->ncols_numeric;
    if (uVar5 < uVar1) {
      pdVar2 = input_data->sample_weights;
      Xc_indptr = input_data->Xc_indptr;
      if (Xc_indptr == (int *)0x0) {
        if ((pdVar2 == (double *)0x0) || (input_data->weight_as_sample == true)) {
          dVar6 = calc_kurtosis<double,double>
                            (input_data->numeric_data + input_data->nrows * uVar5,input_data->nrows,
                             model_params->missing_action);
        }
        else {
          dVar6 = calc_kurtosis_weighted<double,double>
                            (input_data->numeric_data + input_data->nrows * uVar5,input_data->nrows,
                             model_params->missing_action,pdVar2);
        }
      }
      else if ((pdVar2 == (double *)0x0) || (input_data->weight_as_sample == true)) {
        dVar6 = calc_kurtosis<double,int,double>
                          (uVar5,input_data->nrows,input_data->Xc,input_data->Xc_ind,Xc_indptr,
                           model_params->missing_action);
      }
      else {
        dVar6 = calc_kurtosis_weighted<double,int,double>
                          (uVar5,input_data->nrows,input_data->Xc,input_data->Xc_ind,Xc_indptr,
                           model_params->missing_action,pdVar2);
      }
    }
    else if ((input_data->sample_weights == (double *)0x0) || (input_data->weight_as_sample == true)
            ) {
      dVar6 = calc_kurtosis<double>
                        (input_data->nrows,
                         input_data->categ_data + (uVar5 - uVar1) * input_data->nrows,
                         input_data->ncat[uVar5 - uVar1],
                         (size_t *)
                         buffer_size_t._M_t.
                         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                         .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl,
                         (double *)
                         buffer_double._M_t.
                         super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                         super__Head_base<0UL,_double_*,_false>._M_head_impl,
                         model_params->missing_action,model_params->cat_split_type,rnd_generator);
    }
    else {
      dVar6 = calc_kurtosis_weighted<double,double>
                        (input_data->nrows,
                         input_data->categ_data + (uVar5 - uVar1) * input_data->nrows,
                         input_data->ncat[uVar5 - uVar1],
                         (double *)
                         buffer_double._M_t.
                         super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                         super__Head_base<0UL,_double_*,_false>._M_head_impl,
                         model_params->missing_action,model_params->cat_split_type,rnd_generator,
                         input_data->sample_weights);
    }
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar5] = dVar6;
  }
  pdVar3 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar2 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (pdVar4 = pdVar2; pdVar4 != pdVar3; pdVar4 = pdVar4 + 1) {
    dVar6 = 0.0;
    if ((-INFINITY < *pdVar4) && (dVar6 = *pdVar4 + -1.0, dVar6 <= 1e-08)) {
      dVar6 = 1e-08;
    }
    *pdVar4 = dVar6;
  }
  pdVar3 = input_data->col_weights;
  if (pdVar3 != (double *)0x0) {
    for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
      if (0.0 < pdVar2[uVar5]) {
        dVar6 = pdVar2[uVar5] * pdVar3[uVar5];
        if (dVar6 <= 1e-100) {
          dVar6 = 1e-100;
        }
        pdVar2[uVar5] = dVar6;
      }
    }
  }
  std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::~unique_ptr
            (&buffer_size_t);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&buffer_double);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> calc_kurtosis_all_data(InputData &input_data, ModelParams &model_params, RNG_engine &rnd_generator)
{
    std::unique_ptr<double[]> buffer_double;
    std::unique_ptr<size_t[]> buffer_size_t;
    if (input_data.ncols_categ)
    {
        buffer_double = std::unique_ptr<double[]>(new double[input_data.max_categ]);
        if (!(input_data.sample_weights != NULL && !input_data.weight_as_sample))
            buffer_size_t = std::unique_ptr<size_t[]>(new size_t[input_data.max_categ + 1]);
    }


    std::vector<double> kurt_weights(input_data.ncols_numeric + input_data.ncols_categ);
    for (size_t col = 0; col < input_data.ncols_tot; col++)
    {
        if (col < input_data.ncols_numeric)
        {
            if (input_data.Xc_indptr == NULL)
            {
                if (!(input_data.sample_weights != NULL && !input_data.weight_as_sample))
                {
                    kurt_weights[col]
                        = calc_kurtosis<typename std::remove_pointer<decltype(input_data.numeric_data)>::type, ldouble_safe>(
                                        input_data.numeric_data + col * input_data.nrows,
                                        input_data.nrows, model_params.missing_action);
                }

                else
                {
                    kurt_weights[col]
                        = calc_kurtosis_weighted<typename std::remove_pointer<decltype(input_data.numeric_data)>::type,
                                                 ldouble_safe>(
                                                 input_data.numeric_data + col * input_data.nrows, input_data.nrows,
                                                 model_params.missing_action, input_data.sample_weights);
                }
            }

            else
            {
                if (!(input_data.sample_weights != NULL && !input_data.weight_as_sample))
                {
                    kurt_weights[col]
                        = calc_kurtosis<typename std::remove_pointer<decltype(input_data.Xc)>::type,
                                        typename std::remove_pointer<decltype(input_data.Xc_indptr)>::type,
                                        ldouble_safe>(
                                        col, input_data.nrows,
                                        input_data.Xc, input_data.Xc_ind, input_data.Xc_indptr,
                                        model_params.missing_action);
                }

                else
                {
                    kurt_weights[col]
                        = calc_kurtosis_weighted<typename std::remove_pointer<decltype(input_data.Xc)>::type,
                                                 typename std::remove_pointer<decltype(input_data.Xc_indptr)>::type,
                                                 ldouble_safe>(
                                                 col, input_data.nrows,
                                                 input_data.Xc, input_data.Xc_ind, input_data.Xc_indptr,
                                                 model_params.missing_action, input_data.sample_weights);
                }
            }
        }

        else
        {
            if (!(input_data.sample_weights != NULL && !input_data.weight_as_sample))
            {
                kurt_weights[col]
                        = calc_kurtosis<ldouble_safe>(input_data.nrows,
                                        input_data.categ_data + (col- input_data.ncols_numeric) * input_data.nrows,
                                        input_data.ncat[col - input_data.ncols_numeric],
                                        buffer_size_t.get(), buffer_double.get(),
                                        model_params.missing_action, model_params.cat_split_type, rnd_generator);
            }

            else
            {
                kurt_weights[col]
                        = calc_kurtosis_weighted<typename std::remove_pointer<decltype(input_data.sample_weights)>::type,
                                                 ldouble_safe>(
                                                 input_data.nrows,
                                                 input_data.categ_data + (col- input_data.ncols_numeric) * input_data.nrows,
                                                 input_data.ncat[col - input_data.ncols_numeric],
                                                 buffer_double.get(),
                                                 model_params.missing_action, model_params.cat_split_type,
                                                 rnd_generator, input_data.sample_weights);
            }
        }
    }

    for (auto &w : kurt_weights) w = (w == -HUGE_VAL)? 0. : std::fmax(1e-8, -1. + w);
    if (input_data.col_weights != NULL)
    {
        for (size_t col = 0; col < input_data.ncols_tot; col++)
        {
            if (kurt_weights[col] <= 0) continue;
            kurt_weights[col] *= input_data.col_weights[col];
            kurt_weights[col] = std::fmax(kurt_weights[col], 1e-100);
        }
    }

    return kurt_weights;
}